

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O2

void __thiscall
ctemplate::JsonEscape::Modify
          (JsonEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  char cVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uStack_40;
  
  pcVar6 = in + inlen;
  uVar2 = 2;
  do {
    lVar4 = 0;
LAB_0012f182:
    pcVar5 = in + lVar4;
    if (pcVar6 <= pcVar5) {
      if (pcVar5 <= in) {
        return;
      }
      (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      return;
    }
    cVar1 = *pcVar5;
    uStack_40 = uVar2;
    switch(cVar1) {
    case '\b':
      if (in < pcVar5) {
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      }
      pp_Var3 = out->_vptr_ExpandEmitter;
      pcVar5 = "\\b";
      goto LAB_0012f350;
    case '\t':
      if (in < pcVar5) {
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      }
      pp_Var3 = out->_vptr_ExpandEmitter;
      pcVar5 = "\\t";
      goto LAB_0012f350;
    case '\n':
      if (in < pcVar5) {
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      }
      pp_Var3 = out->_vptr_ExpandEmitter;
      pcVar5 = "\\n";
      goto LAB_0012f350;
    case '\v':
switchD_0012f1d8_caseD_b:
      lVar4 = lVar4 + 1;
      goto LAB_0012f182;
    case '\f':
      if (in < pcVar5) {
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      }
      pp_Var3 = out->_vptr_ExpandEmitter;
      pcVar5 = "\\f";
      goto LAB_0012f350;
    case '\r':
      if (in < pcVar5) {
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      }
      pp_Var3 = out->_vptr_ExpandEmitter;
      pcVar5 = "\\r";
      goto LAB_0012f350;
    }
    if (cVar1 == '\"') {
      if (in < pcVar5) {
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      }
      pp_Var3 = out->_vptr_ExpandEmitter;
      pcVar5 = "\\\"";
      goto LAB_0012f350;
    }
    if (cVar1 == '&') {
      if (in < pcVar5) {
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      }
      pp_Var3 = out->_vptr_ExpandEmitter;
      pcVar5 = "\\u0026";
LAB_0012f37f:
      uStack_40 = 6;
      goto LAB_0012f350;
    }
    if (cVar1 == '/') {
      if (in < pcVar5) {
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      }
      pp_Var3 = out->_vptr_ExpandEmitter;
      pcVar5 = "\\/";
      goto LAB_0012f350;
    }
    if (cVar1 == '<') {
      if (in < pcVar5) {
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      }
      pp_Var3 = out->_vptr_ExpandEmitter;
      pcVar5 = "\\u003C";
      goto LAB_0012f37f;
    }
    if (cVar1 == '>') {
      if (in < pcVar5) {
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
      }
      pp_Var3 = out->_vptr_ExpandEmitter;
      pcVar5 = "\\u003E";
      goto LAB_0012f37f;
    }
    if (cVar1 != '\\') goto switchD_0012f1d8_caseD_b;
    if (in < pcVar5) {
      (*out->_vptr_ExpandEmitter[5])(out,in,lVar4);
    }
    pp_Var3 = out->_vptr_ExpandEmitter;
    pcVar5 = "\\\\";
LAB_0012f350:
    (*pp_Var3[5])(out,pcVar5,uStack_40);
    in = in + lVar4 + 1;
  } while( true );
}

Assistant:

void JsonEscape::Modify(const char* in, size_t inlen,
                        const PerExpandData*,
                        ExpandEmitter* out, const string& arg) const {
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit) {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      case '"':  EmitRun(start, pos, out); APPEND("\\\"");    break;
      case '\\': EmitRun(start, pos, out); APPEND("\\\\");    break;
      case '/':  EmitRun(start, pos, out); APPEND("\\/");     break;
      case '\b': EmitRun(start, pos, out); APPEND("\\b");     break;
      case '\f': EmitRun(start, pos, out); APPEND("\\f");     break;
      case '\n': EmitRun(start, pos, out); APPEND("\\n");     break;
      case '\r': EmitRun(start, pos, out); APPEND("\\r");     break;
      case '\t': EmitRun(start, pos, out); APPEND("\\t");     break;
      case '&':  EmitRun(start, pos, out); APPEND("\\u0026"); break;
      case '<':  EmitRun(start, pos, out); APPEND("\\u003C"); break;
      case '>':  EmitRun(start, pos, out); APPEND("\\u003E"); break;
    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
}